

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

void free_entry(conf_entry *entry)

{
  conf_entry *entry_local;
  
  free_key(&entry->key);
  free_value(&entry->value,valuetypes[(entry->key).primary]);
  safefree(entry);
  return;
}

Assistant:

static void free_entry(struct conf_entry *entry)
{
    free_key(&entry->key);
    free_value(&entry->value, valuetypes[entry->key.primary]);
    sfree(entry);
}